

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void shift64ExtraRightJamming(uint64_t a0,uint64_t a1,int count,uint64_t *z0Ptr,uint64_t *z1Ptr)

{
  uint64_t uStack_40;
  int8_t negCount;
  uint64_t z1;
  uint64_t z0;
  uint64_t *z1Ptr_local;
  uint64_t *z0Ptr_local;
  int count_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  uStack_40 = a1;
  z1 = a0;
  if (count != 0) {
    if (count < 0x40) {
      uStack_40 = a0 << (-(byte)count & 0x3f) | (long)(int)(uint)(a1 != 0);
      z1 = a0 >> ((byte)count & 0x3f);
    }
    else {
      if (count == 0x40) {
        uStack_40 = a0 | (long)(int)(uint)(a1 != 0);
      }
      else {
        uStack_40 = (uint64_t)(int)(uint)(a0 != 0 || a1 != 0);
      }
      z1 = 0;
    }
  }
  *z1Ptr = uStack_40;
  *z0Ptr = z1;
  return;
}

Assistant:

static inline void
 shift64ExtraRightJamming(
     uint64_t a0, uint64_t a1, int count, uint64_t *z0Ptr, uint64_t *z1Ptr)
{
    uint64_t z0, z1;
    int8_t negCount = ( - count ) & 63;

    if ( count == 0 ) {
        z1 = a1;
        z0 = a0;
    }
    else if ( count < 64 ) {
        z1 = ( a0<<negCount ) | ( a1 != 0 );
        z0 = a0>>count;
    }
    else {
        if ( count == 64 ) {
            z1 = a0 | ( a1 != 0 );
        }
        else {
            z1 = ( ( a0 | a1 ) != 0 );
        }
        z0 = 0;
    }
    *z1Ptr = z1;
    *z0Ptr = z0;

}